

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O3

string * EncodeBase64_abi_cxx11_(string *__return_storage_ptr__,Span<const_unsigned_char> input)

{
  byte bVar1;
  long lVar2;
  undefined1 auVar3 [16];
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  byte *pbVar8;
  ulong uVar9;
  byte *pbVar10;
  long in_FS_OFFSET;
  
  sVar4 = input.m_size;
  pbVar10 = input.m_data;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = sVar4 + 2;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (__return_storage_ptr__,
             SUB168(auVar3 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 & 0xfffffffffffffffc);
  if (sVar4 != 0) {
    pbVar8 = pbVar10 + sVar4;
    uVar9 = 0;
    uVar5 = 0;
    do {
      bVar1 = *pbVar10;
      uVar9 = (ulong)(((uint)uVar9 & 0x1f) << 8) | (ulong)bVar1;
      uVar7 = uVar5 + 8;
      lVar6 = uVar5 + 2;
      do {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,
                   "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                   [(uint)(uVar9 >> ((byte)lVar6 & 0x3f)) & 0x3f]);
        uVar7 = uVar7 - 6;
        lVar6 = lVar6 + -6;
      } while (5 < uVar7);
      pbVar10 = pbVar10 + 1;
      uVar5 = uVar7;
    } while (pbVar10 != pbVar8);
    if (uVar7 != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (__return_storage_ptr__,
                 "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                 [(uint)bVar1 << (-(char)lVar6 & 0x3fU) & 0x3f]);
    }
  }
  while ((__return_storage_ptr__->_M_string_length & 3) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,'=');
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string EncodeBase64(Span<const unsigned char> input)
{
    static const char *pbase64 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";

    std::string str;
    str.reserve(((input.size() + 2) / 3) * 4);
    ConvertBits<8, 6, true>([&](int v) { str += pbase64[v]; }, input.begin(), input.end());
    while (str.size() % 4) str += '=';
    return str;
}